

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O3

CURLcode global_init(long flags,_Bool memoryfuncs)

{
  uint uVar1;
  int iVar2;
  CURLcode CVar3;
  bool bVar4;
  
  uVar1 = initialized + 1;
  CVar3 = CURLE_OK;
  bVar4 = initialized == 0;
  initialized = uVar1;
  if (bVar4) {
    if (memoryfuncs) {
      Curl_cmalloc = malloc;
      Curl_cfree = free;
      Curl_crealloc = realloc;
      Curl_cstrdup = strdup;
      Curl_ccalloc = calloc;
    }
    iVar2 = Curl_ssl_init();
    CVar3 = CURLE_FAILED_INIT;
    if (iVar2 != 0) {
      iVar2 = Curl_resolver_global_init();
      if (iVar2 == 0) {
        Curl_ipv6works();
        if ((flags & 4U) != 0) {
          Curl_ack_eintr = 1;
        }
        Curl_version_init();
        CVar3 = CURLE_OK;
      }
    }
  }
  return CVar3;
}

Assistant:

static CURLcode global_init(long flags, bool memoryfuncs)
{
  if(initialized++)
    return CURLE_OK;

  if(memoryfuncs) {
    /* Setup the default memory functions here (again) */
    Curl_cmalloc = (curl_malloc_callback)malloc;
    Curl_cfree = (curl_free_callback)free;
    Curl_crealloc = (curl_realloc_callback)realloc;
    Curl_cstrdup = (curl_strdup_callback)system_strdup;
    Curl_ccalloc = (curl_calloc_callback)calloc;
#if defined(WIN32) && defined(UNICODE)
    Curl_cwcsdup = (curl_wcsdup_callback)_wcsdup;
#endif
  }

  if(!Curl_ssl_init()) {
    DEBUGF(fprintf(stderr, "Error: Curl_ssl_init failed\n"));
    return CURLE_FAILED_INIT;
  }

  if(flags & CURL_GLOBAL_WIN32)
    if(win32_init()) {
      DEBUGF(fprintf(stderr, "Error: win32_init failed\n"));
      return CURLE_FAILED_INIT;
    }

#ifdef __AMIGA__
  if(!Curl_amiga_init()) {
    DEBUGF(fprintf(stderr, "Error: Curl_amiga_init failed\n"));
    return CURLE_FAILED_INIT;
  }
#endif

#ifdef NETWARE
  if(netware_init()) {
    DEBUGF(fprintf(stderr, "Warning: LONG namespace not available\n"));
  }
#endif

  if(Curl_resolver_global_init()) {
    DEBUGF(fprintf(stderr, "Error: resolver_global_init failed\n"));
    return CURLE_FAILED_INIT;
  }

  (void)Curl_ipv6works();

#if defined(USE_LIBSSH2) && defined(HAVE_LIBSSH2_INIT)
  if(libssh2_init(0)) {
    DEBUGF(fprintf(stderr, "Error: libssh2_init failed\n"));
    return CURLE_FAILED_INIT;
  }
#endif

#if defined(USE_LIBSSH)
  if(ssh_init()) {
    DEBUGF(fprintf(stderr, "Error: libssh_init failed\n"));
    return CURLE_FAILED_INIT;
  }
#endif

  if(flags & CURL_GLOBAL_ACK_EINTR)
    Curl_ack_eintr = 1;

  init_flags = flags;

  Curl_version_init();

  return CURLE_OK;
}